

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O2

bool __thiscall mcsFile::OpenFile(mcsFile *this,string *fileName)

{
  char cVar1;
  ostream *poVar2;
  
  std::ifstream::open((char *)this,(_Ios_Openmode)(fileName->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cerr,"mcsFile: could not open input file ");
    poVar2 = std::operator<<(poVar2,(string *)fileName);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    this->line_num = 0;
  }
  return (bool)cVar1;
}

Assistant:

bool mcsFile::OpenFile(const std::string &fileName)
{
    file.open(fileName.c_str());
    if (!file.is_open()) {
        std::cerr << "mcsFile: could not open input file " << fileName << std::endl;
        return false;
    }
    line_num = 0;
    return true;
}